

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

void __thiscall
capnp::anon_unknown_1::CppTypeName::addMemberTemplate
          (CppTypeName *this,StringPtr innerName,
          Array<capnp::(anonymous_namespace)::CppTypeName> *params)

{
  StringTree *this_00;
  bool local_f6;
  undefined1 local_f5 [13];
  ArrayPtr<const_char> local_e8;
  anon_class_8_1_8991fb9c local_d8;
  Mapper<kj::Array<capnp::(anonymous_namespace)::CppTypeName>_&> local_d0;
  Array<kj::StringTree> local_c8;
  StringTree local_b0;
  undefined1 local_71 [9];
  StringTree local_68;
  byte local_29;
  Array<capnp::(anonymous_namespace)::CppTypeName> *pAStack_28;
  bool parentIsArgDependent;
  Array<capnp::(anonymous_namespace)::CppTypeName> *params_local;
  CppTypeName *this_local;
  StringPtr innerName_local;
  
  innerName_local.content.ptr = (char *)innerName.content.size_;
  this_local = (CppTypeName *)innerName.content.ptr;
  local_29 = this->isArgDependent & 1;
  this->needsTypename = (bool)local_29;
  local_f6 = true;
  if ((this->hasDisambiguatedTemplate_ & 1U) == 0) {
    local_f6 = (bool)local_29;
  }
  this->hasDisambiguatedTemplate_ = local_f6;
  pAStack_28 = params;
  params_local = (Array<capnp::(anonymous_namespace)::CppTypeName> *)this;
  this_00 = kj::mv<kj::StringTree>(&this->name);
  local_71._1_8_ = "::";
  if ((local_29 & 1) != 0) {
    local_71._1_8_ = "::template ";
  }
  local_71[0] = 0x3c;
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CppTypeName>_&>::Mapper
            (&local_d0,pAStack_28);
  local_d8.this = this;
  kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CppTypeName>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:241:24)>
            (&local_c8,&local_d0,&local_d8);
  kj::StringPtr::StringPtr((StringPtr *)&local_e8,", ");
  kj::StringTree::StringTree(&local_b0,&local_c8,(StringPtr)local_e8);
  local_f5[0] = 0x3e;
  kj::strTree<kj::StringTree,char_const*,kj::StringPtr&,char,kj::StringTree,char>
            (&local_68,(kj *)this_00,(StringTree *)(local_71 + 1),(char **)&this_local,
             (StringPtr *)local_71,(char *)&local_b0,(StringTree *)local_f5,(char *)this_00);
  kj::StringTree::operator=(&this->name,&local_68);
  kj::StringTree::~StringTree(&local_68);
  kj::StringTree::~StringTree(&local_b0);
  kj::Array<kj::StringTree>::~Array(&local_c8);
  return;
}

Assistant:

void addMemberTemplate(kj::StringPtr innerName, kj::Array<CppTypeName>&& params) {
    // Append "::innerName<params, ...>".
    //
    // If necessary, add the "template" disambiguation keyword in front of `innerName`.

    bool parentIsArgDependent = isArgDependent;
    needsTypename = parentIsArgDependent;
    hasDisambiguatedTemplate_ = hasDisambiguatedTemplate_ || parentIsArgDependent;

    name = kj::strTree(kj::mv(name),
        parentIsArgDependent ? "::template " : "::",
        innerName, '<',
        kj::StringTree(KJ_MAP(p, params) {
          if (p.isArgDependent) isArgDependent = true;
          if (p.hasInterfaces_) hasInterfaces_ = true;
          if (p.hasDisambiguatedTemplate_) hasDisambiguatedTemplate_ = true;
          return kj::strTree(kj::mv(p));
        }, ", "),
        '>');
  }